

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool double_conversion::FastDtoa
               (double v,FastDtoaMode mode,int requested_digits,Vector<char> buffer,int *length,
               int *decimal_point)

{
  long lVar1;
  char *pcVar2;
  undefined4 in_ECX;
  double in_RDX;
  uint in_EDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  int *in_XMM0_Qa;
  bool result;
  int decimal_exponent;
  undefined1 in_stack_00000100 [16];
  bool local_61;
  uint in_stack_ffffffffffffffc0;
  int iVar3;
  int *in_stack_ffffffffffffffd0;
  FastDtoaMode FStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  if (in_EDI < 2) {
    local_61 = Grisu3(in_RDX,FStack_c,(Vector<char>)in_stack_00000100,(int *)in_RDX,
                      in_stack_ffffffffffffffd0);
  }
  else {
    if (in_EDI != 2) {
      abort();
    }
    local_61 = Grisu3Counted((double)CONCAT44(FStack_c,in_ECX),(int)((ulong)in_RDX >> 0x20),buffer,
                             (int *)(ulong)in_stack_ffffffffffffffc0,in_XMM0_Qa);
  }
  if (local_61 != false) {
    *in_R9 = *in_R8 + iVar3;
    pcVar2 = Vector<char>::operator[]((Vector<char> *)&stack0xffffffffffffffe8,*in_R8);
    *pcVar2 = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_61;
  }
  __stack_chk_fail();
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}